

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

bool __thiscall
MakefileGenerator::processPrlFile(MakefileGenerator *this,QString *file,bool baseOnly)

{
  char16_t *pcVar1;
  qsizetype originalLength;
  char cVar2;
  byte bVar3;
  bool bVar4;
  CutResult CVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  storage_type_conflict *psVar9;
  undefined7 in_register_00000011;
  QString *pQVar10;
  undefined1 *puVar11;
  int iVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringBuilder<QString_&,_QString_&> local_80;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  fileFixify(&local_58,this,file,(FileFixifyTypes)0x3,true);
  if (((int)CONCAT71(in_register_00000011,baseOnly) == 0) &&
     (cVar2 = QString::endsWith((QString *)&local_58,0x2e2a40), cVar2 != '\0')) {
    bVar3 = processPrlFileCore(this,file,(QStringView)ZEXT816(0),&local_58);
  }
  else {
    local_80.b = &Option::prl_ext;
    local_80.a = &local_58;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>(&local_70,&local_80);
    bVar4 = processPrlFileCore(this,file,(QStringView)ZEXT816(0),&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    originalLength = local_58.d.size;
    pcVar1 = local_58.d.ptr;
    bVar3 = 1;
    if (!bVar4) {
      if (!baseOnly) {
        QVar13.m_data = local_58.d.ptr;
        QVar13.m_size = local_58.d.size;
        lVar7 = QtPrivate::lastIndexOf(QVar13,-1,L'/',CaseSensitive);
        QVar14.m_data = pcVar1;
        QVar14.m_size = originalLength;
        lVar8 = QtPrivate::lastIndexOf(QVar14,-1,L'\\',CaseSensitive);
        iVar12 = (int)lVar8;
        if (lVar8 < lVar7) {
          iVar12 = (int)lVar7;
        }
        iVar12 = iVar12 + 1;
        local_80.a = (QString *)0xffffffffffffffff;
        local_70.d.d = (Data *)(long)iVar12;
        CVar5 = QtPrivate::QContainerImplHelper::mid
                          (originalLength,(qsizetype *)&local_70,(qsizetype *)&local_80);
        if (CVar5 == Null) {
          pQVar10 = (QString *)0x0;
          psVar9 = (storage_type_conflict *)0x0;
        }
        else {
          psVar9 = pcVar1 + (long)local_70.d.d;
          pQVar10 = local_80.a;
        }
        QVar15.m_data = psVar9;
        QVar15.m_size = (qsizetype)pQVar10;
        iVar6 = QtPrivate::lastIndexOf(QVar15,-1,L'.',CaseSensitive);
        pcVar1 = local_58.d.ptr;
        if (iVar6 != -1) {
          local_80.a = (QString *)0xffffffffffffffff;
          local_70.d.d = (Data *)(long)iVar12;
          CVar5 = QtPrivate::QContainerImplHelper::mid
                            (local_58.d.size,(qsizetype *)&local_70,(qsizetype *)&local_80);
          if (CVar5 == Null) {
            pQVar10 = (QString *)0x0;
            psVar9 = (storage_type_conflict *)0x0;
          }
          else {
            psVar9 = pcVar1 + (long)local_70.d.d;
            pQVar10 = local_80.a;
          }
          puVar11 = (undefined1 *)(long)(iVar12 + iVar6);
          if ((ulong)local_58.d.size < (undefined1 *)(long)(iVar12 + iVar6)) {
            puVar11 = (undefined1 *)local_58.d.size;
          }
          iVar12 = (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x19])
                             (this,file,pQVar10,psVar9,puVar11,local_58.d.ptr,iVar12);
        }
        bVar3 = (byte)iVar12;
        if (iVar6 != -1) goto LAB_00163866;
      }
      bVar3 = 0;
    }
  }
LAB_00163866:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool
MakefileGenerator::processPrlFile(QString &file, bool baseOnly)
{
    QString f = fileFixify(file, FileFixifyBackwards);
    // Explicitly given full .prl name
    if (!baseOnly && f.endsWith(Option::prl_ext))
        return processPrlFileCore(file, QStringView(), f);
    // Explicitly given or derived (from -l) base name
    if (processPrlFileCore(file, QStringView(), f + Option::prl_ext))
        return true;
    if (!baseOnly) {
        // Explicitly given full library name
        int off = qMax(f.lastIndexOf('/'), f.lastIndexOf('\\')) + 1;
        int ext = QStringView(f).mid(off).lastIndexOf('.');
        if (ext != -1)
            return processPrlFileBase(file, QStringView(f).mid(off), QStringView{f}.left(off + ext), off);
    }
    return false;
}